

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  int number;
  undefined4 uVar1;
  OneofDescriptor *oneof_descriptor;
  ulong uVar2;
  long *plVar3;
  uint32_t uVar4;
  undefined8 *puVar5;
  LogMessage *other;
  long lVar6;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_70 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,&local_70)
    ;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  if (((byte)field[1] & 8) == 0) {
    oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
    if ((oneof_descriptor == (OneofDescriptor *)0x0 || ((byte)field[1] & 0x10) == 0) ||
       ((*(int *)(oneof_descriptor + 4) == 1 &&
        ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)))) {
      if (sub_message == (Message *)0x0) {
        ClearBit(this,message,field);
      }
      else {
        SetBit(this,message,field);
      }
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar2 = (message->super_MessageLite)._internal_metadata_.ptr_;
      puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar5 = (undefined8 *)*puVar5;
      }
      if ((puVar5 == (undefined8 *)0x0) &&
         (plVar3 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
         plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
      *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
           sub_message;
    }
    else {
      ClearOneof(this,message,oneof_descriptor);
      if (sub_message != (Message *)0x0) {
        uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
        *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
             sub_message;
        if (((byte)field[1] & 0x10) == 0) {
          lVar6 = 0;
        }
        else {
          lVar6 = *(long *)(field + 0x28);
        }
        uVar1 = *(undefined4 *)(field + 4);
        if ((*(int *)(lVar6 + 4) == 1) && ((*(byte *)(*(long *)(lVar6 + 0x20) + 1) & 2) != 0)) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x97b);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        *(undefined4 *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite +
         (ulong)(uint)((int)((ulong)(lVar6 - *(long *)(*(long *)(lVar6 + 0x10) + 0x30)) >> 3) *
                       0x33333334 + (this->schema_).oneof_case_offset_)) = uVar1;
      }
    }
  }
  else {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 4);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_70);
    }
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),number,
               (FieldType)field[2],field,&sub_message->super_MessageLite);
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);


  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (message->GetArenaForAllocation() == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}